

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.c
# Opt level: O1

sysbvm_tuple_t
sysbvm_type_lookupSelector(sysbvm_context_t *context,sysbvm_tuple_t type,sysbvm_tuple_t selector)

{
  sysbvm_tuple_t sVar1;
  uint uVar2;
  bool bVar3;
  sysbvm_object_tuple_t *object_1;
  sysbvm_object_tuple_t *object;
  sysbvm_globalLookupCacheEntry_t *psVar4;
  
  if (((type & 0xf) == 0 && type != 0) && ((*(byte *)(type + 8) & 0x80) == 0)) {
    bVar3 = (selector & 0xf) != 0 || selector == 0;
    if (bVar3) {
      uVar2 = (int)selector * 0x41c64e6d;
    }
    else {
      uVar2 = *(uint *)(selector + 8) >> 10;
    }
    uVar2 = uVar2 + (*(uint *)(type + 8) >> 10) * 0x6d & 0xff;
    psVar4 = (context->roots).globalMethodLookupCache + uVar2;
    if ((psVar4->type == type) &&
       ((context->roots).globalMethodLookupCache[uVar2].selector == selector)) {
      sVar1 = (context->roots).globalMethodLookupCache[uVar2].method;
    }
    else {
      sVar1 = sysbvm_type_lookupSelectorRecursively
                        ((sysbvm_context_t *)type,selector,CONCAT71((int7)(selector >> 8),bVar3));
      if (sVar1 != 0) {
        psVar4->type = type;
        (context->roots).globalMethodLookupCache[uVar2].selector = selector;
        (context->roots).globalMethodLookupCache[uVar2].method = sVar1;
      }
    }
  }
  else {
    sVar1 = 0;
  }
  return sVar1;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_type_lookupSelector(sysbvm_context_t *context, sysbvm_tuple_t type, sysbvm_tuple_t selector)
{
    if(!sysbvm_tuple_isNonNullPointer(type)) return SYSBVM_NULL_TUPLE;
    if(sysbvm_tuple_isDummyValue(type)) return SYSBVM_NULL_TUPLE;

    // FIXME: Make this cache atomic and thread safe.
    size_t cacheEntryIndex = computeLookupCacheEntryIndexFor(type, selector);
    sysbvm_globalLookupCacheEntry_t *cacheEntry = context->roots.globalMethodLookupCache + cacheEntryIndex;
    if(cacheEntry->type != type || cacheEntry->selector != selector)
    {
        sysbvm_tuple_t method = sysbvm_type_lookupSelectorRecursively(context, type, selector);
        if(method)
        {
            cacheEntry->type = type;
            cacheEntry->selector = selector;
            cacheEntry->method = method;
        }
        return method;
    }
    else
    {
        return cacheEntry->method;
    }
}